

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

CBlock * GetBlockChecked(BlockManager *blockman,CBlockIndex *blockindex)

{
  long lVar1;
  bool bVar2;
  AnnotatedMixin<std::recursive_mutex> *pszName;
  undefined8 uVar3;
  BlockManager *in_RDX;
  CBlockIndex *in_RSI;
  CBlock *in_RDI;
  long in_FS_OFFSET;
  CBlock *block;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock32;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff58;
  CBlock *pszFile;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar4;
  CBlock *block_00;
  BlockManager *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0;
  pszFile = in_RDI;
  block_00 = in_RDI;
  CBlock::CBlock(in_RDI);
  pszName = MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>(in_stack_ffffffffffffff58);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),(char *)pszName,
             (char *)pszFile,(int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  CheckBlockDataAvailability
            (in_RDX,(CBlockIndex *)CONCAT17(uVar4,in_stack_ffffffffffffffa0),
             (bool)in_stack_ffffffffffffff9f);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff58);
  bVar2 = node::BlockManager::ReadBlockFromDisk(in_stack_ffffffffffffffc0,block_00,in_RSI);
  if (bVar2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return pszFile;
    }
  }
  else {
    uVar3 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDX,
               (char *)CONCAT17(uVar4,in_stack_ffffffffffffffa0),
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    JSONRPCError((int)((ulong)in_RDX >> 0x20),
                 (string *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

static CBlock GetBlockChecked(BlockManager& blockman, const CBlockIndex& blockindex)
{
    CBlock block;
    {
        LOCK(cs_main);
        CheckBlockDataAvailability(blockman, blockindex, /*check_for_undo=*/false);
    }

    if (!blockman.ReadBlockFromDisk(block, blockindex)) {
        // Block not found on disk. This shouldn't normally happen unless the block was
        // pruned right after we released the lock above.
        throw JSONRPCError(RPC_MISC_ERROR, "Block not found on disk");
    }

    return block;
}